

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O3

int testDefaultOptionalValueOnUnsupportedSpec(void)

{
  RepeatedField<long> *pRVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  ModelDescription *pMVar5;
  Type *pTVar6;
  FeatureType *pFVar7;
  ArrayFeatureType *pAVar8;
  TypeUnion this;
  Type *this_00;
  Type *pTVar9;
  LayerUnion this_01;
  ostream *poVar10;
  string *psVar11;
  long lVar12;
  Rep *pRVar13;
  int iVar14;
  int iVar15;
  Result res;
  Model m;
  undefined1 local_78 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  Model local_50;
  
  CoreML::Specification::Model::Model(&local_50);
  if (local_50.description_ == (ModelDescription *)0x0) {
    pMVar5 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar5);
    local_50.description_ = pMVar5;
  }
  pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_50.description_)->input_).super_RepeatedPtrFieldBase,(Type *)0x0);
  pcVar2 = local_78 + 0x10;
  local_78._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"input1","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar6->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_78);
  if ((pointer)local_78._0_8_ != pcVar2) {
    operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
  }
  pFVar7 = pTVar6->type_;
  if (pFVar7 == (FeatureType *)0x0) {
    pFVar7 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar7);
    pTVar6->type_ = pFVar7;
  }
  if (pFVar7->_oneof_case_[0] == 5) {
    pAVar8 = (pFVar7->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar7);
    pFVar7->_oneof_case_[0] = 5;
    pAVar8 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar8);
    (pFVar7->Type_).multiarraytype_ = pAVar8;
  }
  pAVar8->datatype_ = 0x10020;
  pRVar1 = &pAVar8->shape_;
  iVar15 = (pAVar8->shape_).current_size_;
  iVar14 = (pAVar8->shape_).total_size_;
  if (iVar15 == iVar14) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar15 + 1);
    iVar15 = (pAVar8->shape_).current_size_;
    iVar14 = (pAVar8->shape_).total_size_;
  }
  pRVar13 = (pAVar8->shape_).rep_;
  iVar4 = iVar15 + 1;
  (pAVar8->shape_).current_size_ = iVar4;
  pRVar13->elements[iVar15] = 3;
  if (iVar4 == iVar14) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar15 + 2);
    iVar4 = (pAVar8->shape_).current_size_;
    iVar14 = (pAVar8->shape_).total_size_;
    pRVar13 = (pAVar8->shape_).rep_;
  }
  iVar15 = iVar4 + 1;
  pRVar1->current_size_ = iVar15;
  pRVar13->elements[iVar4] = 5;
  if (iVar15 == iVar14) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar4 + 2);
    iVar15 = (pAVar8->shape_).current_size_;
    pRVar13 = (pAVar8->shape_).rep_;
  }
  pRVar1->current_size_ = iVar15 + 1;
  pRVar13->elements[iVar15] = 2;
  if (local_50.description_ == (ModelDescription *)0x0) {
    pMVar5 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar5);
    local_50.description_ = pMVar5;
  }
  pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_50.description_)->input_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_78._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"input2","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar6->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_78);
  if ((pointer)local_78._0_8_ != pcVar2) {
    operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
  }
  pFVar7 = pTVar6->type_;
  if (pFVar7 == (FeatureType *)0x0) {
    pFVar7 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar7);
    pTVar6->type_ = pFVar7;
  }
  pFVar7->isoptional_ = true;
  if (pFVar7->_oneof_case_[0] == 5) {
    pAVar8 = (pFVar7->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar7);
    pFVar7->_oneof_case_[0] = 5;
    pAVar8 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar8);
    (pFVar7->Type_).multiarraytype_ = pAVar8;
  }
  pAVar8->datatype_ = 0x20020;
  if (pAVar8->_oneof_case_[1] != 0x29) {
    CoreML::Specification::ArrayFeatureType::clear_defaultOptionalValue(pAVar8);
    pAVar8->_oneof_case_[1] = 0x29;
  }
  (pAVar8->defaultOptionalValue_).intdefaultvalue_ = 2;
  pRVar1 = &pAVar8->shape_;
  iVar15 = (pAVar8->shape_).current_size_;
  iVar14 = (pAVar8->shape_).total_size_;
  if (iVar15 == iVar14) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar15 + 1);
    iVar15 = (pAVar8->shape_).current_size_;
    iVar14 = (pAVar8->shape_).total_size_;
  }
  pRVar13 = (pAVar8->shape_).rep_;
  iVar4 = iVar15 + 1;
  (pAVar8->shape_).current_size_ = iVar4;
  pRVar13->elements[iVar15] = 3;
  if (iVar4 == iVar14) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar15 + 2);
    iVar4 = (pAVar8->shape_).current_size_;
    iVar14 = (pAVar8->shape_).total_size_;
    pRVar13 = (pAVar8->shape_).rep_;
  }
  iVar15 = iVar4 + 1;
  pRVar1->current_size_ = iVar15;
  pRVar13->elements[iVar4] = 5;
  if (iVar15 == iVar14) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar4 + 2);
    iVar15 = (pAVar8->shape_).current_size_;
    pRVar13 = (pAVar8->shape_).rep_;
  }
  pRVar1->current_size_ = iVar15 + 1;
  pRVar13->elements[iVar15] = 2;
  if (local_50.description_ == (ModelDescription *)0x0) {
    pMVar5 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar5);
    local_50.description_ = pMVar5;
  }
  pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_50.description_)->output_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_78._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"output","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar6->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_78);
  if ((pointer)local_78._0_8_ != pcVar2) {
    operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
  }
  pFVar7 = pTVar6->type_;
  if (pFVar7 == (FeatureType *)0x0) {
    pFVar7 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar7);
    pTVar6->type_ = pFVar7;
  }
  if (pFVar7->_oneof_case_[0] == 5) {
    pAVar8 = (pFVar7->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar7);
    pFVar7->_oneof_case_[0] = 5;
    pAVar8 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar8);
    (pFVar7->Type_).multiarraytype_ = pAVar8;
  }
  pAVar8->datatype_ = 0x10020;
  pRVar1 = &pAVar8->shape_;
  iVar15 = (pAVar8->shape_).current_size_;
  iVar14 = (pAVar8->shape_).total_size_;
  if (iVar15 == iVar14) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar15 + 1);
    iVar15 = (pAVar8->shape_).current_size_;
    iVar14 = (pAVar8->shape_).total_size_;
  }
  pRVar13 = (pAVar8->shape_).rep_;
  iVar4 = iVar15 + 1;
  (pAVar8->shape_).current_size_ = iVar4;
  pRVar13->elements[iVar15] = 3;
  if (iVar4 == iVar14) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar15 + 2);
    iVar4 = (pAVar8->shape_).current_size_;
    iVar14 = (pAVar8->shape_).total_size_;
    pRVar13 = (pAVar8->shape_).rep_;
  }
  iVar15 = iVar4 + 1;
  pRVar1->current_size_ = iVar15;
  pRVar13->elements[iVar4] = 5;
  if (iVar15 == iVar14) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar4 + 2);
    iVar15 = (pAVar8->shape_).current_size_;
    pRVar13 = (pAVar8->shape_).rep_;
  }
  pRVar1->current_size_ = iVar15 + 1;
  pRVar13->elements[iVar15] = 1;
  if (local_50._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&local_50);
    local_50._oneof_case_[0] = 500;
    this.pipelineclassifier_ = (PipelineClassifier *)operator_new(0x58);
    CoreML::Specification::NeuralNetwork::NeuralNetwork(this.neuralnetwork_);
    local_50.Type_.pipelineclassifier_ = this.pipelineclassifier_;
  }
  (local_50.Type_.neuralnetworkregressor_)->arrayinputshapemapping_ = 1;
  this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                      ((RepeatedPtrFieldBase *)&(local_50.Type_.pipeline_)->models_,(Type *)0x0);
  CoreML::Specification::NeuralNetworkLayer::add_input(this_00,"input1");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_00,"output");
  pTVar9 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::Tensor>::TypeHandler>
                     (&(this_00->inputtensor_).super_RepeatedPtrFieldBase,(Type *)0x0);
  pTVar9->rank_ = 3;
  if (this_00->_oneof_case_[0] == 0x39d) {
    this_01 = this_00->layer_;
  }
  else {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(this_00);
    this_00->_oneof_case_[0] = 0x39d;
    this_01.convolution_ = (ConvolutionLayerParams *)operator_new(0x20);
    CoreML::Specification::StackLayerParams::StackLayerParams(this_01.stack_);
    (this_00->layer_).stack_ = (StackLayerParams *)this_01;
  }
  (this_01.activation_)->NonlinearityType_ = (NonlinearityTypeUnion)0x2;
  local_50.specificationversion_ = 4;
  CoreML::Model::validate((Result *)local_78,&local_50);
  bVar3 = CoreML::Result::good((Result *)local_78);
  if (bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x70);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x157);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"!((res).good())",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
  }
  else {
    psVar11 = CoreML::Result::message_abi_cxx11_((Result *)local_78);
    iVar15 = 0;
    lVar12 = std::__cxx11::string::find((char *)psVar11,0x3261cf,0);
    if (lVar12 != -1) goto LAB_00163236;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x70);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x158);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,
               "res.message().find(\"Default value for optional inputs is supported from specification 5 (iOS 14)\") != std::string::npos"
               ,0x77);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
  }
  std::ostream::put((char)poVar10);
  iVar15 = 1;
  std::ostream::flush();
LAB_00163236:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._8_8_ != &local_60) {
    operator_delete((void *)local_78._8_8_,local_60._0_8_ + 1);
  }
  CoreML::Specification::Model::~Model(&local_50);
  return iVar15;
}

Assistant:

int testDefaultOptionalValueOnUnsupportedSpec() {

    Specification::Model m;

    auto *in1 = m.mutable_description()->add_input();
    in1->set_name("input1");
    auto *inShape1 = in1->mutable_type()->mutable_multiarraytype();
    inShape1->set_datatype(Specification::ArrayFeatureType::ArrayDataType::ArrayFeatureType_ArrayDataType_FLOAT32);

    inShape1->add_shape(3);
    inShape1->add_shape(5);
    inShape1->add_shape(2);

    auto *in2 = m.mutable_description()->add_input();
    in2->set_name("input2");
    auto type = in2->mutable_type();
    type->set_isoptional(true);
    auto arr = type->mutable_multiarraytype();
    arr->set_datatype(Specification::ArrayFeatureType::ArrayDataType::ArrayFeatureType_ArrayDataType_INT32);
    arr->set_intdefaultvalue(2);
    arr->add_shape(3);
    arr->add_shape(5);
    arr->add_shape(2);

    auto *out = m.mutable_description()->add_output();
    out->set_name("output");
    auto *outShape = out->mutable_type()->mutable_multiarraytype();
    outShape->set_datatype(Specification::ArrayFeatureType::ArrayDataType::ArrayFeatureType_ArrayDataType_FLOAT32);
    outShape->add_shape(3);
    outShape->add_shape(5);
    outShape->add_shape(1);

    const auto nn = m.mutable_neuralnetwork();
    nn->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);

    auto *layers = nn->add_layers();
    layers->add_input("input1");
    layers->add_output("output");
    layers->add_inputtensor()->set_rank(3);

    auto *params = layers->mutable_stack();
    params->set_axis(2);

    m.set_specificationversion(4);
    // axis should be in range [-(rank + 1), rank + 1)
    Result res = Model::validate(m);
    ML_ASSERT_BAD(res);
    ML_ASSERT(res.message().find("Default value for optional inputs is supported from specification 5 (iOS 14)") != std::string::npos);

    return 0;
}